

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

splice_left_ptrs compute_left_ptrs_for_sync(__cilkrts_worker *w,full_frame *ff)

{
  splice_left_ptrs sVar1;
  long in_RSI;
  splice_left_ptrs left_ptrs;
  cilkred_map **local_10;
  pending_exception_info **local_8;
  
  if (*(long *)(in_RSI + 0x40) == 0) {
    local_10 = (cilkred_map **)(in_RSI + 0x50);
    local_8 = (pending_exception_info **)(in_RSI + 0x68);
  }
  else {
    if (*(long *)(*(long *)(in_RSI + 0x40) + 0x28) != in_RSI) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0xd73,"ff->rightmost_child->parent == ff");
    }
    local_10 = (cilkred_map **)(*(long *)(in_RSI + 0x40) + 0x58);
    local_8 = (pending_exception_info **)(*(long *)(in_RSI + 0x40) + 0x70);
  }
  sVar1.exception_ptr = local_8;
  sVar1.map_ptr = local_10;
  return sVar1;
}

Assistant:

static inline
splice_left_ptrs compute_left_ptrs_for_sync(__cilkrts_worker *w,
                                            full_frame *ff)
{
    // ASSERT: we hold the lock on ff
    splice_left_ptrs left_ptrs;

    // Figure out which map to the left we should merge into.
    if (ff->rightmost_child) {
        CILK_ASSERT(ff->rightmost_child->parent == ff);
        left_ptrs.map_ptr = &(ff->rightmost_child->right_reducer_map);
        left_ptrs.exception_ptr = &(ff->rightmost_child->right_pending_exception);
    }
    else {
        // We have no children.  Then, we should be the last
        // worker at the sync... "left" is our child map.
        left_ptrs.map_ptr = &(ff->children_reducer_map);
        left_ptrs.exception_ptr = &(ff->child_pending_exception);
    }
    return left_ptrs;
}